

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_level
          (crn_unpacker *this,void *pSrc,uint32 src_size_in_bytes,void **pDst,
          uint32 dst_size_in_bytes,uint32 row_pitch_in_bytes,uint32 level_index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint output_width;
  bool bVar4;
  bool local_51;
  bool status;
  uint32 minimal_row_pitch;
  uint32 block_size;
  uint32 blocks_y;
  uint32 blocks_x;
  uint32 height;
  uint32 width;
  uint32 row_pitch_in_bytes_local;
  uint32 dst_size_in_bytes_local;
  void **pDst_local;
  uint32 src_size_in_bytes_local;
  void *pSrc_local;
  crn_unpacker *this_local;
  
  uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_width);
  uVar1 = math::maximum<unsigned_int>(uVar1 >> ((byte)level_index & 0x1f),1);
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_height);
  uVar2 = math::maximum<unsigned_int>(uVar2 >> ((byte)level_index & 0x1f),1);
  output_width = uVar1 + 3 >> 2;
  uVar2 = uVar2 + 3 >> 2;
  uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_format);
  bVar4 = true;
  if (uVar1 != 0) {
    uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&this->m_pHeader->m_format);
    bVar4 = true;
    if (uVar1 != 9) {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_format);
      bVar4 = true;
      if (uVar1 != 10) {
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)&this->m_pHeader->m_format);
        bVar4 = true;
        if (uVar1 != 0xb) {
          uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&this->m_pHeader->m_format);
          bVar4 = uVar1 == 0xd;
        }
      }
    }
  }
  iVar3 = 0x10;
  if (bVar4) {
    iVar3 = 8;
  }
  height = iVar3 * output_width;
  if ((row_pitch_in_bytes == 0) ||
     ((height <= row_pitch_in_bytes && (height = row_pitch_in_bytes, (row_pitch_in_bytes & 3) == 0))
     )) {
    if (dst_size_in_bytes < height * uVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar4 = symbol_codec::start_decoding(&this->m_codec,(uint8 *)pSrc,src_size_in_bytes);
      if (bVar4) {
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)&this->m_pHeader->m_format);
        switch(uVar1) {
        case 0:
        case 0xd:
          local_51 = unpack_dxt1(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        default:
          return false;
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 0xe:
          local_51 = unpack_dxt5(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        case 7:
        case 8:
          local_51 = unpack_dxn(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        case 9:
          local_51 = unpack_dxt5a(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        case 10:
          local_51 = unpack_etc1(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        case 0xb:
          local_51 = unpack_etc1(this,(uint8 **)pDst,height,output_width,uVar2);
          break;
        case 0xc:
          local_51 = unpack_etc2a(this,(uint8 **)pDst,height,output_width,uVar2);
        }
        if (local_51 == false) {
          this_local._7_1_ = false;
        }
        else {
          symbol_codec::stop_decoding(&this->m_codec);
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool unpack_level(
            const void* pSrc, uint32 src_size_in_bytes,
            void** pDst, uint32 dst_size_in_bytes, uint32 row_pitch_in_bytes,
            uint32 level_index)
        {
#ifdef CRND_BUILD_DEBUG
            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
                if (!pDst[f])
                    return false;
#endif

            const uint32 width = math::maximum(m_pHeader->m_width >> level_index, 1U);
            const uint32 height = math::maximum(m_pHeader->m_height >> level_index, 1U);
            const uint32 blocks_x = (width + 3U) >> 2U;
            const uint32 blocks_y = (height + 3U) >> 2U;
            const uint32 block_size = m_pHeader->m_format == cCRNFmtDXT1 || m_pHeader->m_format == cCRNFmtDXT5A || m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC1S ? 8 : 16;

            uint32 minimal_row_pitch = block_size * blocks_x;
            if (!row_pitch_in_bytes)
                row_pitch_in_bytes = minimal_row_pitch;
            else if ((row_pitch_in_bytes < minimal_row_pitch) || (row_pitch_in_bytes & 3))
                return false;
            if (dst_size_in_bytes < row_pitch_in_bytes * blocks_y)
                return false;

            if (!m_codec.start_decoding(static_cast<const crnd::uint8*>(pSrc), src_size_in_bytes))
                return false;

            bool status = false;
            switch (m_pHeader->m_format)
            {
                case cCRNFmtDXT1:
                case cCRNFmtETC1S:
                    status = unpack_dxt1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXT5:
                case cCRNFmtDXT5_CCxY:
                case cCRNFmtDXT5_xGBR:
                case cCRNFmtDXT5_AGBR:
                case cCRNFmtDXT5_xGxR:
                case cCRNFmtETC2AS:
                    status = unpack_dxt5((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXT5A:
                    status = unpack_dxt5a((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXN_XY:
                case cCRNFmtDXN_YX:
                    status = unpack_dxn((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC1:
                    status = unpack_etc1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC2:
                    status = unpack_etc1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC2A:
                    status = unpack_etc2a((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                default:
                    return false;
            }
            if (!status)
                return false;

            m_codec.stop_decoding();
            return true;
        }